

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_fp16s.h
# Opt level: O3

void ncnn::innerproduct_fp16s_pack4_sse_f16c
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_fp16,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  int iVar7;
  void *pvVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  float *pfVar17;
  uint uVar18;
  long lVar19;
  undefined1 (*pauVar20) [32];
  float fVar21;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar29;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  float fVar63;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  
  iVar7 = top_blob->w;
  if (0 < (long)iVar7) {
    pvVar8 = bias_data->data;
    uVar16 = bottom_blob->elempack * bottom_blob->w;
    lVar13 = 0;
    auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar76 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
    auVar62 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    do {
      fVar21 = 0.0;
      fVar26 = 0.0;
      fVar27 = 0.0;
      fVar28 = 0.0;
      if (pvVar8 != (void *)0x0) {
        pfVar17 = (float *)((long)pvVar8 + lVar13 * 0x10);
        fVar21 = *pfVar17;
        fVar26 = pfVar17[1];
        fVar27 = pfVar17[2];
        fVar28 = pfVar17[3];
      }
      pauVar20 = (undefined1 (*) [32])
                 (weight_data_fp16->w * lVar13 * weight_data_fp16->elemsize +
                 (long)weight_data_fp16->data);
      pfVar17 = (float *)bottom_blob->data;
      if ((int)uVar16 < 8) {
        fVar63 = 0.0;
        fVar68 = 0.0;
        fVar69 = 0.0;
        fVar70 = 0.0;
        fVar71 = 0.0;
        fVar72 = 0.0;
        fVar73 = 0.0;
        fVar29 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar77 = 0.0;
        fVar78 = 0.0;
        fVar79 = 0.0;
        fVar80 = 0.0;
        fVar81 = 0.0;
        fVar82 = 0.0;
        fVar83 = 0.0;
        fVar84 = 0.0;
        fVar85 = 0.0;
        fVar86 = 0.0;
        fVar87 = 0.0;
        fVar88 = 0.0;
        fVar89 = 0.0;
        fVar90 = 0.0;
        uVar18 = 0;
      }
      else {
        fVar84 = 0.0;
        fVar85 = 0.0;
        fVar86 = 0.0;
        fVar87 = 0.0;
        fVar88 = 0.0;
        fVar89 = 0.0;
        fVar90 = 0.0;
        iVar14 = 7;
        fVar77 = 0.0;
        fVar78 = 0.0;
        fVar79 = 0.0;
        fVar80 = 0.0;
        fVar81 = 0.0;
        fVar82 = 0.0;
        fVar83 = 0.0;
        fVar29 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar63 = 0.0;
        fVar68 = 0.0;
        fVar69 = 0.0;
        fVar70 = 0.0;
        fVar71 = 0.0;
        fVar72 = 0.0;
        fVar73 = 0.0;
        do {
          fVar1 = *pfVar17;
          fVar2 = pfVar17[1];
          fVar3 = pfVar17[2];
          fVar4 = pfVar17[4];
          fVar5 = pfVar17[6];
          auVar9 = vlddqu_avx(*pauVar20);
          auVar10 = vlddqu_avx(pauVar20[1]);
          auVar11 = vcvtph2ps_f16c(auVar9._0_16_);
          fVar84 = fVar84 + auVar11._0_4_ * fVar1;
          fVar85 = fVar85 + auVar11._4_4_ * fVar1;
          fVar86 = fVar86 + auVar11._8_4_ * fVar1;
          fVar87 = fVar87 + auVar11._12_4_ * fVar1;
          fVar88 = fVar88 + auVar11._16_4_ * fVar2;
          fVar89 = fVar89 + auVar11._24_4_ * fVar2;
          fVar90 = fVar90 + fVar2;
          auVar9 = vcvtph2ps_f16c(auVar9._16_16_);
          fVar77 = fVar77 + fVar3 * auVar9._0_4_;
          fVar78 = fVar78 + fVar3 * auVar9._4_4_;
          fVar79 = fVar79 + fVar3 * auVar9._8_4_;
          fVar80 = fVar80 + fVar3 * auVar9._12_4_;
          fVar81 = fVar81 + pfVar17[3] * auVar9._16_4_;
          fVar82 = fVar82 + pfVar17[3] * auVar9._24_4_;
          fVar83 = fVar83 + auVar9._28_4_;
          auVar9 = vcvtph2ps_f16c(auVar10._0_16_);
          fVar29 = fVar4 * auVar9._0_4_ + fVar29;
          fVar39 = fVar4 * auVar9._4_4_ + fVar39;
          fVar40 = fVar4 * auVar9._8_4_ + fVar40;
          fVar41 = fVar4 * auVar9._12_4_ + fVar41;
          fVar42 = pfVar17[5] * auVar9._16_4_ + fVar42;
          fVar43 = pfVar17[5] * auVar9._24_4_ + fVar43;
          fVar44 = auVar9._28_4_ + fVar44;
          auVar9 = vcvtph2ps_f16c(auVar10._16_16_);
          fVar63 = fVar5 * auVar9._0_4_ + fVar63;
          fVar68 = fVar5 * auVar9._4_4_ + fVar68;
          fVar69 = fVar5 * auVar9._8_4_ + fVar69;
          fVar70 = fVar5 * auVar9._12_4_ + fVar70;
          fVar71 = pfVar17[7] * auVar9._16_4_ + fVar71;
          fVar72 = pfVar17[7] * auVar9._24_4_ + fVar72;
          fVar73 = auVar9._28_4_ + fVar73;
          pfVar17 = pfVar17 + 8;
          pauVar20 = pauVar20 + 2;
          iVar14 = iVar14 + 8;
          uVar18 = uVar16 & 0xfffffff8;
        } while (iVar14 < (int)uVar16);
      }
      uVar15 = uVar18 | 3;
      while ((int)uVar15 < (int)uVar16) {
        fVar1 = *pfVar17;
        fVar2 = pfVar17[1];
        fVar3 = pfVar17[2];
        auVar9 = vlddqu_avx(*pauVar20);
        auVar10 = vcvtph2ps_f16c(auVar9._0_16_);
        fVar84 = fVar84 + auVar10._0_4_ * fVar1;
        fVar85 = fVar85 + auVar10._4_4_ * fVar1;
        fVar86 = fVar86 + auVar10._8_4_ * fVar1;
        fVar87 = fVar87 + auVar10._12_4_ * fVar1;
        fVar88 = fVar88 + auVar10._16_4_ * fVar2;
        fVar89 = fVar89 + auVar10._24_4_ * fVar2;
        fVar90 = fVar90 + fVar2;
        auVar9 = vcvtph2ps_f16c(auVar9._16_16_);
        fVar77 = fVar77 + fVar3 * auVar9._0_4_;
        fVar78 = fVar78 + fVar3 * auVar9._4_4_;
        fVar79 = fVar79 + fVar3 * auVar9._8_4_;
        fVar80 = fVar80 + fVar3 * auVar9._12_4_;
        fVar81 = fVar81 + pfVar17[3] * auVar9._16_4_;
        fVar82 = fVar82 + pfVar17[3] * auVar9._24_4_;
        fVar83 = fVar83 + auVar9._28_4_;
        pfVar17 = pfVar17 + 4;
        pauVar20 = pauVar20 + 1;
        uVar15 = uVar18 + 7;
        uVar18 = uVar18 + 4;
      }
      if (uVar16 - uVar18 != 0 && (int)uVar18 <= (int)uVar16) {
        lVar19 = 0;
        do {
          fVar1 = pfVar17[lVar19];
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)(*pauVar20 + lVar19 * 8);
          auVar47 = vcvtph2ps_f16c(auVar47);
          fVar21 = fVar1 * auVar47._0_4_ + fVar21;
          fVar26 = fVar1 * auVar47._4_4_ + fVar26;
          fVar27 = fVar1 * auVar47._8_4_ + fVar27;
          fVar28 = fVar1 * auVar47._12_4_ + fVar28;
          lVar19 = lVar19 + 1;
        } while (uVar16 - uVar18 != (int)lVar19);
      }
      fVar78 = fVar39 + fVar68 + fVar78 + fVar85;
      auVar22._0_4_ = fVar42 + fVar71 + fVar81 + fVar88 + fVar29 + fVar63 + fVar77 + fVar84 + fVar21
      ;
      auVar22._4_4_ = fVar78 + fVar78 + fVar26;
      auVar22._8_4_ = fVar43 + fVar72 + fVar82 + fVar89 + fVar40 + fVar69 + fVar79 + fVar86 + fVar27
      ;
      auVar22._12_4_ =
           fVar44 + fVar73 + fVar83 + fVar90 + fVar41 + fVar70 + fVar80 + fVar87 + fVar28;
      auVar47 = auVar61._0_16_;
      fVar77 = auVar76._0_4_;
      fVar78 = auVar76._4_4_;
      fVar79 = auVar76._8_4_;
      fVar80 = auVar76._12_4_;
      auVar33 = auVar62._0_16_;
      fVar21 = auVar62._0_4_;
      fVar26 = auVar62._4_4_;
      fVar27 = auVar62._8_4_;
      fVar28 = auVar62._12_4_;
      switch(activation_type) {
      case 1:
        auVar22 = vmaxps_avx(auVar22,auVar47);
        break;
      case 2:
        auVar33 = vmaxps_avx(auVar22,auVar47);
        auVar47 = vminps_avx(auVar22,auVar47);
        fVar21 = *activation_params->data;
        auVar22._0_4_ = fVar21 * auVar47._0_4_ + auVar33._0_4_;
        auVar22._4_4_ = fVar21 * auVar47._4_4_ + auVar33._4_4_;
        auVar22._8_4_ = fVar21 * auVar47._8_4_ + auVar33._8_4_;
        auVar22._12_4_ = fVar21 * auVar47._12_4_ + auVar33._12_4_;
        break;
      case 3:
        uVar6 = *activation_params->data;
        auVar34._4_4_ = uVar6;
        auVar34._0_4_ = uVar6;
        auVar34._8_4_ = uVar6;
        auVar34._12_4_ = uVar6;
        uVar6 = *(undefined4 *)((long)activation_params->data + 4);
        auVar53._4_4_ = uVar6;
        auVar53._0_4_ = uVar6;
        auVar53._8_4_ = uVar6;
        auVar53._12_4_ = uVar6;
        auVar47 = vmaxps_avx(auVar22,auVar34);
        auVar22 = vminps_avx(auVar47,auVar53);
        break;
      case 4:
        uVar12 = CONCAT44(auVar22._4_4_,auVar22._0_4_);
        auVar23._0_8_ = uVar12 ^ 0x8000000080000000;
        auVar23._8_4_ = -auVar22._8_4_;
        auVar23._12_4_ = -auVar22._12_4_;
        auVar35._8_4_ = 0x42b0c0a5;
        auVar35._0_8_ = 0x42b0c0a542b0c0a5;
        auVar35._12_4_ = 0x42b0c0a5;
        auVar47 = vminps_avx(auVar23,auVar35);
        auVar36._8_4_ = 0xc2b0c0a5;
        auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar36._12_4_ = 0xc2b0c0a5;
        auVar57 = vmaxps_avx(auVar47,auVar36);
        auVar37._0_4_ = fVar77 + auVar57._0_4_ * 1.442695;
        auVar37._4_4_ = fVar78 + auVar57._4_4_ * 1.442695;
        auVar37._8_4_ = fVar79 + auVar57._8_4_ * 1.442695;
        auVar37._12_4_ = fVar80 + auVar57._12_4_ * 1.442695;
        auVar54._0_4_ = (int)auVar37._0_4_;
        auVar54._4_4_ = (int)auVar37._4_4_;
        auVar54._8_4_ = (int)auVar37._8_4_;
        auVar54._12_4_ = (int)auVar37._12_4_;
        auVar22 = vcvtdq2ps_avx(auVar54);
        auVar47 = vcmpps_avx(auVar37,auVar22,1);
        auVar47 = vandps_avx(auVar47,auVar33);
        auVar47 = vsubps_avx(auVar22,auVar47);
        fVar81 = auVar57._0_4_ + auVar47._0_4_ * -0.6931472;
        fVar82 = auVar57._4_4_ + auVar47._4_4_ * -0.6931472;
        fVar83 = auVar57._8_4_ + auVar47._8_4_ * -0.6931472;
        fVar84 = auVar57._12_4_ + auVar47._12_4_ * -0.6931472;
        auVar38._0_4_ = (int)auVar47._0_4_;
        auVar38._4_4_ = (int)auVar47._4_4_;
        auVar38._8_4_ = (int)auVar47._8_4_;
        auVar38._12_4_ = (int)auVar47._12_4_;
        auVar47 = vpslld_avx(auVar38,0x17);
        auVar47 = vpaddd_avx(auVar47,auVar33);
        auVar24._0_4_ =
             (fVar81 + fVar21 +
             fVar81 * fVar81 *
             (fVar77 + ((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
                        0.041665796) * fVar81 + 0.16666666) * fVar81)) * auVar47._0_4_ + fVar21;
        auVar24._4_4_ =
             (fVar82 + fVar26 +
             fVar82 * fVar82 *
             (fVar78 + ((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
                        0.041665796) * fVar82 + 0.16666666) * fVar82)) * auVar47._4_4_ + fVar26;
        auVar24._8_4_ =
             (fVar83 + fVar27 +
             fVar83 * fVar83 *
             (fVar79 + ((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
                        0.041665796) * fVar83 + 0.16666666) * fVar83)) * auVar47._8_4_ + fVar27;
        auVar24._12_4_ =
             (fVar84 + fVar28 +
             fVar84 * fVar84 *
             (fVar80 + ((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
                        0.041665796) * fVar84 + 0.16666666) * fVar84)) * auVar47._12_4_ + fVar28;
        auVar47 = vrcpps_avx(auVar24);
        fVar21 = auVar47._0_4_;
        auVar25._0_4_ = auVar24._0_4_ * fVar21;
        fVar26 = auVar47._4_4_;
        auVar25._4_4_ = auVar24._4_4_ * fVar26;
        fVar27 = auVar47._8_4_;
        auVar25._8_4_ = auVar24._8_4_ * fVar27;
        fVar28 = auVar47._12_4_;
        auVar25._12_4_ = auVar24._12_4_ * fVar28;
        auVar47 = vsubps_avx(auVar33,auVar25);
        auVar22._0_4_ = fVar21 + fVar21 * auVar47._0_4_;
        auVar22._4_4_ = fVar26 + fVar26 * auVar47._4_4_;
        auVar22._8_4_ = fVar27 + fVar27 * auVar47._8_4_;
        auVar22._12_4_ = fVar28 + fVar28 * auVar47._12_4_;
        break;
      case 5:
        auVar74._8_4_ = 0x42b0c0a5;
        auVar74._0_8_ = 0x42b0c0a542b0c0a5;
        auVar74._12_4_ = 0x42b0c0a5;
        auVar47 = vminps_avx(auVar74,auVar22);
        auVar75._8_4_ = 0xc2b0c0a5;
        auVar75._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar75._12_4_ = 0xc2b0c0a5;
        auVar31 = vmaxps_avx(auVar75,auVar47);
        auVar45._0_4_ = fVar77 + auVar31._0_4_ * 1.442695;
        auVar45._4_4_ = fVar78 + auVar31._4_4_ * 1.442695;
        auVar45._8_4_ = fVar79 + auVar31._8_4_ * 1.442695;
        auVar45._12_4_ = fVar80 + auVar31._12_4_ * 1.442695;
        auVar55._0_4_ = (int)auVar45._0_4_;
        auVar55._4_4_ = (int)auVar45._4_4_;
        auVar55._8_4_ = (int)auVar45._8_4_;
        auVar55._12_4_ = (int)auVar45._12_4_;
        auVar57 = vcvtdq2ps_avx(auVar55);
        auVar47 = vcmpps_avx(auVar45,auVar57,1);
        auVar47 = vandps_avx(auVar47,auVar33);
        auVar47 = vsubps_avx(auVar57,auVar47);
        auVar56._0_4_ = auVar47._0_4_ * 0.6931472;
        auVar56._4_4_ = auVar47._4_4_ * 0.6931472;
        auVar56._8_4_ = auVar47._8_4_ * 0.6931472;
        auVar56._12_4_ = auVar47._12_4_ * 0.6931472;
        auVar57 = vsubps_avx(auVar31,auVar56);
        fVar81 = auVar57._0_4_;
        fVar82 = auVar57._4_4_;
        fVar83 = auVar57._8_4_;
        fVar84 = auVar57._12_4_;
        auVar46._0_4_ = (int)auVar47._0_4_;
        auVar46._4_4_ = (int)auVar47._4_4_;
        auVar46._8_4_ = (int)auVar47._8_4_;
        auVar46._12_4_ = (int)auVar47._12_4_;
        auVar47 = vpslld_avx(auVar46,0x17);
        auVar47 = vpaddd_avx(auVar47,auVar33);
        auVar30._0_4_ =
             (fVar81 + fVar21 +
             fVar81 * fVar81 *
             (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
               0.041665796) * fVar81 + 0.16666666) * fVar81 + fVar77)) * auVar47._0_4_ + fVar21;
        auVar30._4_4_ =
             (fVar82 + fVar26 +
             fVar82 * fVar82 *
             (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
               0.041665796) * fVar82 + 0.16666666) * fVar82 + fVar78)) * auVar47._4_4_ + fVar26;
        auVar30._8_4_ =
             (fVar83 + fVar27 +
             fVar83 * fVar83 *
             (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
               0.041665796) * fVar83 + 0.16666666) * fVar83 + fVar79)) * auVar47._8_4_ + fVar27;
        auVar30._12_4_ =
             (fVar84 + fVar28 +
             fVar84 * fVar84 *
             (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
               0.041665796) * fVar84 + 0.16666666) * fVar84 + fVar80)) * auVar47._12_4_ + fVar28;
        auVar48._8_4_ = 0x800000;
        auVar48._0_8_ = 0x80000000800000;
        auVar48._12_4_ = 0x800000;
        auVar47 = vmaxps_avx(auVar30,auVar48);
        auVar57 = vpsrld_avx(auVar47,0x17);
        auVar64._8_4_ = 0xffffff82;
        auVar64._0_8_ = 0xffffff82ffffff82;
        auVar64._12_4_ = 0xffffff82;
        auVar57 = vpaddd_avx(auVar57,auVar64);
        auVar65._8_4_ = 0x807fffff;
        auVar65._0_8_ = 0x807fffff807fffff;
        auVar65._12_4_ = 0x807fffff;
        auVar47 = vandps_avx(auVar47,auVar65);
        auVar32 = vorps_avx(auVar47,auVar76._0_16_);
        auVar31 = vcvtdq2ps_avx(auVar57);
        auVar66._8_4_ = 0x3f3504f3;
        auVar66._0_8_ = 0x3f3504f33f3504f3;
        auVar66._12_4_ = 0x3f3504f3;
        auVar57 = vcmpps_avx(auVar32,auVar66,1);
        auVar47 = vandps_avx(auVar57,auVar32);
        fVar81 = auVar47._0_4_ + auVar32._0_4_ + -1.0;
        fVar82 = auVar47._4_4_ + auVar32._4_4_ + -1.0;
        fVar83 = auVar47._8_4_ + auVar32._8_4_ + -1.0;
        fVar84 = auVar47._12_4_ + auVar32._12_4_ + -1.0;
        auVar47 = vandps_avx(auVar57,auVar33);
        auVar57 = vsubps_avx(auVar31,auVar47);
        auVar47 = vcmpps_avx(auVar30,_DAT_00524a60,2);
        auVar76 = ZEXT1664(auVar76._0_16_);
        auVar49._0_4_ =
             (auVar57._0_4_ * 0.6931472 + fVar81 +
             (((((((((fVar81 * 0.070376836 + -0.1151461) * fVar81 + 0.116769984) * fVar81 +
                   -0.12420141) * fVar81 + 0.14249323) * fVar81 + -0.16668057) * fVar81 + 0.20000714
                ) * fVar81 + -0.24999994) * fVar81 + 0.3333333) * fVar81 + -0.5) * fVar81 * fVar81)
             * -2.0;
        auVar49._4_4_ =
             (auVar57._4_4_ * 0.6931472 + fVar82 +
             (((((((((fVar82 * 0.070376836 + -0.1151461) * fVar82 + 0.116769984) * fVar82 +
                   -0.12420141) * fVar82 + 0.14249323) * fVar82 + -0.16668057) * fVar82 + 0.20000714
                ) * fVar82 + -0.24999994) * fVar82 + 0.3333333) * fVar82 + -0.5) * fVar82 * fVar82)
             * -2.0;
        auVar49._8_4_ =
             (auVar57._8_4_ * 0.6931472 + fVar83 +
             (((((((((fVar83 * 0.070376836 + -0.1151461) * fVar83 + 0.116769984) * fVar83 +
                   -0.12420141) * fVar83 + 0.14249323) * fVar83 + -0.16668057) * fVar83 + 0.20000714
                ) * fVar83 + -0.24999994) * fVar83 + 0.3333333) * fVar83 + -0.5) * fVar83 * fVar83)
             * -2.0;
        auVar49._12_4_ =
             (auVar57._12_4_ * 0.6931472 + fVar84 +
             (((((((((fVar84 * 0.070376836 + -0.1151461) * fVar84 + 0.116769984) * fVar84 +
                   -0.12420141) * fVar84 + 0.14249323) * fVar84 + -0.16668057) * fVar84 + 0.20000714
                ) * fVar84 + -0.24999994) * fVar84 + 0.3333333) * fVar84 + -0.5) * fVar84 * fVar84)
             * -2.0;
        auVar58._8_4_ = 0x7fffffff;
        auVar58._0_8_ = 0x7fffffff7fffffff;
        auVar58._12_4_ = 0x7fffffff;
        auVar47 = vblendvps_avx(auVar49,auVar58,auVar47);
        auVar50._8_4_ = 0x42b0c0a5;
        auVar50._0_8_ = 0x42b0c0a542b0c0a5;
        auVar50._12_4_ = 0x42b0c0a5;
        auVar47 = vminps_avx(auVar47,auVar50);
        auVar31 = vmaxps_avx(auVar75,auVar47);
        auVar51._0_4_ = auVar31._0_4_ * 1.442695 + fVar77;
        auVar51._4_4_ = auVar31._4_4_ * 1.442695 + fVar78;
        auVar51._8_4_ = auVar31._8_4_ * 1.442695 + fVar79;
        auVar51._12_4_ = auVar31._12_4_ * 1.442695 + fVar80;
        auVar59._0_4_ = (int)auVar51._0_4_;
        auVar59._4_4_ = (int)auVar51._4_4_;
        auVar59._8_4_ = (int)auVar51._8_4_;
        auVar59._12_4_ = (int)auVar51._12_4_;
        auVar57 = vcvtdq2ps_avx(auVar59);
        auVar47 = vcmpps_avx(auVar51,auVar57,1);
        auVar47 = vandps_avx(auVar47,auVar33);
        auVar47 = vsubps_avx(auVar57,auVar47);
        auVar60._0_4_ = auVar47._0_4_ * 0.6931472;
        auVar60._4_4_ = auVar47._4_4_ * 0.6931472;
        auVar60._8_4_ = auVar47._8_4_ * 0.6931472;
        auVar60._12_4_ = auVar47._12_4_ * 0.6931472;
        auVar62 = ZEXT1664(auVar33);
        auVar57 = vsubps_avx(auVar31,auVar60);
        fVar81 = auVar57._0_4_;
        fVar82 = auVar57._4_4_;
        fVar83 = auVar57._8_4_;
        fVar84 = auVar57._12_4_;
        auVar61 = ZEXT864(0) << 0x20;
        auVar52._0_4_ = (int)auVar47._0_4_;
        auVar52._4_4_ = (int)auVar47._4_4_;
        auVar52._8_4_ = (int)auVar47._8_4_;
        auVar52._12_4_ = (int)auVar47._12_4_;
        auVar47 = vpslld_avx(auVar52,0x17);
        auVar47 = vpaddd_avx(auVar47,auVar33);
        auVar31._0_4_ =
             (fVar81 + fVar21 +
             fVar81 * fVar81 *
             (fVar77 + ((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
                        0.041665796) * fVar81 + 0.16666666) * fVar81)) * auVar47._0_4_ + fVar21;
        auVar31._4_4_ =
             (fVar82 + fVar26 +
             fVar82 * fVar82 *
             (fVar78 + ((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
                        0.041665796) * fVar82 + 0.16666666) * fVar82)) * auVar47._4_4_ + fVar26;
        auVar31._8_4_ =
             (fVar83 + fVar27 +
             fVar83 * fVar83 *
             (fVar79 + ((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
                        0.041665796) * fVar83 + 0.16666666) * fVar83)) * auVar47._8_4_ + fVar27;
        auVar31._12_4_ =
             (fVar84 + fVar28 +
             fVar84 * fVar84 *
             (fVar80 + ((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
                        0.041665796) * fVar84 + 0.16666666) * fVar84)) * auVar47._12_4_ + fVar28;
        auVar47 = vrcpps_avx(auVar31);
        fVar21 = auVar47._0_4_;
        fVar26 = auVar47._4_4_;
        fVar27 = auVar47._8_4_;
        fVar28 = auVar47._12_4_;
        auVar32._0_4_ = auVar31._0_4_ * (fVar21 + fVar21);
        auVar32._4_4_ = auVar31._4_4_ * (fVar26 + fVar26);
        auVar32._8_4_ = auVar31._8_4_ * (fVar27 + fVar27);
        auVar32._12_4_ = auVar31._12_4_ * (fVar28 + fVar28);
        auVar67._8_4_ = 0x40000000;
        auVar67._0_8_ = 0x4000000040000000;
        auVar67._12_4_ = 0x40000000;
        auVar47 = vsubps_avx(auVar67,auVar32);
        auVar33._0_4_ = fVar21 + fVar21 + -1.0 + fVar21 * auVar47._0_4_;
        auVar33._4_4_ = fVar26 + fVar26 + -1.0 + fVar26 * auVar47._4_4_;
        auVar33._8_4_ = fVar27 + fVar27 + -1.0 + fVar27 * auVar47._8_4_;
        auVar33._12_4_ = fVar28 + fVar28 + -1.0 + fVar28 * auVar47._12_4_;
        goto LAB_0032d2da;
      case 6:
        fVar21 = *activation_params->data;
        fVar26 = *(float *)((long)activation_params->data + 4);
        auVar57._0_4_ = fVar21 * auVar22._0_4_ + fVar26;
        auVar57._4_4_ = fVar21 * auVar22._4_4_ + fVar26;
        auVar57._8_4_ = fVar21 * auVar22._8_4_ + fVar26;
        auVar57._12_4_ = fVar21 * auVar22._12_4_ + fVar26;
        auVar47 = vmaxps_avx(auVar57,auVar47);
        auVar33 = vminps_avx(auVar47,auVar33);
LAB_0032d2da:
        auVar22._0_4_ = auVar33._0_4_ * auVar22._0_4_;
        auVar22._4_4_ = auVar33._4_4_ * auVar22._4_4_;
        auVar22._8_4_ = auVar33._8_4_ * auVar22._8_4_;
        auVar22._12_4_ = auVar33._12_4_ * auVar22._12_4_;
      }
      *(undefined1 (*) [16])((long)top_blob->data + lVar13 * 0x10) = auVar22;
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar7);
  }
  return;
}

Assistant:

static void innerproduct_fp16s_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_fp16, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        innerproduct_fp16s_pack4_sse_f16c(bottom_blob, top_blob, weight_data_fp16, bias_data, activation_type, activation_params, opt);
        return;
    }
#endif

#if __F16C__
    const int num_input = bottom_blob.w * bottom_blob.elempack;
    const int num_output = top_blob.w;

    const float* bias_data_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        __m128 _sum0 = _mm_setzero_ps();

        __m256 _sum01 = _mm256_setzero_ps();
        __m256 _sum23 = _mm256_setzero_ps();
        __m256 _sum45 = _mm256_setzero_ps();
        __m256 _sum67 = _mm256_setzero_ps();

        if (bias_data_ptr)
        {
            _sum0 = _mm_loadu_ps(bias_data_ptr + p * 4);
        }

        const unsigned short* kptr = weight_data_fp16.row<const unsigned short>(p);

        const float* sptr = bottom_blob;

        int i = 0;
        for (; i + 7 < num_input; i += 8)
        {
            __m128 _val0 = _mm_broadcast_ss(sptr);
            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

            __m256 _val01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val0), _val1, 1);
            __m256 _val23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val2), _val3, 1);
            __m256 _val45 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val4), _val5, 1);
            __m256 _val67 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val6), _val7, 1);

            __m256i _w0123 = _mm256_lddqu_si256((const __m256i*)kptr);
            __m256i _w4567 = _mm256_lddqu_si256((const __m256i*)(kptr + 16));

            __m256 _w01 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w0123, 0));
            __m256 _w23 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w0123, 1));
            __m256 _w45 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w4567, 0));
            __m256 _w67 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w4567, 1));

            _sum01 = _mm256_comp_fmadd_ps(_val01, _w01, _sum01);
            _sum23 = _mm256_comp_fmadd_ps(_val23, _w23, _sum23);
            _sum45 = _mm256_comp_fmadd_ps(_val45, _w45, _sum45);
            _sum67 = _mm256_comp_fmadd_ps(_val67, _w67, _sum67);

            sptr += 8;
            kptr += 32;
        }
        for (; i + 3 < num_input; i += 4)
        {
            __m128 _val0 = _mm_set1_ps(sptr[0]);
            __m128 _val1 = _mm_set1_ps(sptr[1]);
            __m128 _val2 = _mm_set1_ps(sptr[2]);
            __m128 _val3 = _mm_set1_ps(sptr[3]);

            __m256 _val01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val0), _val1, 1);
            __m256 _val23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_val2), _val3, 1);

            __m256i _w0123 = _mm256_lddqu_si256((const __m256i*)kptr);
            __m256 _w01 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w0123, 0));
            __m256 _w23 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w0123, 1));

            _sum01 = _mm256_comp_fmadd_ps(_val01, _w01, _sum01);
            _sum23 = _mm256_comp_fmadd_ps(_val23, _w23, _sum23);

            sptr += 4;
            kptr += 16;
        }
        for (; i < num_input; i++)
        {
            __m128 _val = _mm_set1_ps(sptr[0]);
            __m128 _w = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i*)kptr));
            _sum0 = _mm_comp_fmadd_ps(_val, _w, _sum0);

            sptr += 1;
            kptr += 4;
        }

        _sum01 = _mm256_add_ps(_sum01, _sum23);
        _sum45 = _mm256_add_ps(_sum45, _sum67);
        _sum01 = _mm256_add_ps(_sum01, _sum45);

        _sum0 = _mm_add_ps(_sum0, _mm256_extractf128_ps(_sum01, 0));
        _sum0 = _mm_add_ps(_sum0, _mm256_extractf128_ps(_sum01, 1));

        _sum0 = activation_sse(_sum0, activation_type, activation_params);

        float* outptr = top_blob;
        _mm_storeu_ps(outptr + p * 4, _sum0);
    }
#else  // __F16C__
    (void)bottom_blob;
    (void)top_blob;
    (void)weight_data_fp16;
    (void)bias_data;
    (void)activation_type;
    (void)activation_params;
    (void)opt;
#endif // __F16C__
}